

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O3

int __thiscall Server::listen(Server *this,int __fd,int __n)

{
  ushort uVar1;
  int *piVar2;
  pointer piVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ssize_t sVar9;
  runtime_error *prVar10;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __it;
  ulong *puVar16;
  ulong uVar17;
  allocator *paVar18;
  long lVar19;
  int *fileDescriptor;
  ulong uVar20;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __it_00;
  byte bVar21;
  shared_ptr<ClientSocket> clientSocket;
  int clientFileDescriptor;
  unsigned_long clientAddressLength;
  future<void> result;
  sockaddr_in clientAddress;
  fd_set masterSocketSet;
  uint local_1c4;
  Server *local_1c0;
  ulong local_1b8;
  value_type local_1b0;
  pthread_mutex_t *local_1a0;
  uint local_198;
  uint local_194;
  shared_ptr<ClientSocket> *local_190;
  function<void_(std::weak_ptr<ClientSocket>)> *local_188;
  function<void_(std::weak_ptr<ClientSocket>)> *local_180;
  vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_> *local_178;
  socklen_t local_170 [2];
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  uint *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  ulong local_148 [17];
  sockaddr local_c0;
  allocator local_b0 [128];
  
  bVar21 = 0;
  iVar6 = socket(2,1,0);
  this->_socket = iVar6;
  if (iVar6 == -1) {
LAB_00107f4d:
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    std::__cxx11::string::string((string *)local_148,pcVar12,local_b0);
    std::runtime_error::runtime_error(prVar10,(string *)local_148);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148[0] = CONCAT44(local_148[0]._4_4_,1);
  setsockopt(iVar6,1,2,local_148,4);
  local_c0.sa_data[6] = '\0';
  local_c0.sa_data[7] = '\0';
  local_c0.sa_data[8] = '\0';
  local_c0.sa_data[9] = '\0';
  local_c0.sa_data[10] = '\0';
  local_c0.sa_data[0xb] = '\0';
  local_c0.sa_data[0xc] = '\0';
  local_c0.sa_data[0xd] = '\0';
  local_c0.sa_family = 2;
  local_c0.sa_data[2] = '\0';
  local_c0.sa_data[3] = '\0';
  local_c0.sa_data[4] = '\0';
  local_c0.sa_data[5] = '\0';
  uVar1 = (ushort)this->_port;
  local_c0.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  iVar6 = bind(this->_socket,&local_c0,0x10);
  if (iVar6 == -1) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    std::__cxx11::string::string((string *)local_148,pcVar12,local_b0);
    std::runtime_error::runtime_error(prVar10,(string *)local_148);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = ::listen(this->_socket,this->_backlog);
  if (iVar6 == -1) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    std::__cxx11::string::string((string *)local_148,pcVar12,local_b0);
    std::runtime_error::runtime_error(prVar10,(string *)local_148);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148[0] = 0;
  local_148[1] = 0;
  local_148[2] = 0;
  local_148[3] = 0;
  local_148[4] = 0;
  local_148[5] = 0;
  local_148[6] = 0;
  local_148[7] = 0;
  local_148[8] = 0;
  local_148[9] = 0;
  local_148[10] = 0;
  local_148[0xb] = 0;
  local_148[0xc] = 0;
  local_148[0xd] = 0;
  local_148[0xe] = 0;
  local_148[0xf] = 0;
  uVar14 = this->_socket;
  uVar15 = (ulong)uVar14;
  uVar7 = uVar14 + 0x3f;
  if (-1 < (int)uVar14) {
    uVar7 = uVar14;
  }
  local_148[(int)uVar7 >> 6] = local_148[(int)uVar7 >> 6] | 1L << ((byte)uVar14 & 0x3f);
  puVar16 = local_148;
  paVar18 = local_b0;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    *(ulong *)paVar18 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    paVar18 = paVar18 + ((ulong)bVar21 * -2 + 1) * 8;
  }
  iVar6 = select(uVar14 + 1,(fd_set *)local_b0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  if (iVar6 != -1) {
    local_178 = &this->_clientSockets;
    local_188 = &this->_handleRead;
    local_180 = &this->_handleAccept;
    local_1a0 = (pthread_mutex_t *)&this->_staleFileDescriptorsMutex;
    local_1c0 = this;
    do {
      local_1c4 = 0;
      uVar14 = (uint)uVar15;
      if (-1 < (int)uVar14) {
        uVar17 = 0;
        uVar20 = uVar15;
        local_1b8 = uVar15;
        do {
          uVar14 = (uint)uVar20;
          iVar6 = (int)uVar17;
          iVar8 = iVar6 + 0x3f;
          if (-1 < iVar6) {
            iVar8 = iVar6;
          }
          if ((*(ulong *)(local_b0 + (long)(iVar8 >> 6) * 8) >> (uVar17 & 0x3f) & 1) != 0) {
            if (iVar6 == this->_socket) {
              local_170[0] = 0x10;
              local_170[1] = 0;
              local_194 = accept(iVar6,(sockaddr *)&local_158,local_170);
              if (local_194 == 0xffffffff) break;
              uVar14 = local_194 + 0x3f;
              if (-1 < (int)local_194) {
                uVar14 = local_194;
              }
              local_148[(int)uVar14 >> 6] =
                   local_148[(int)uVar14 >> 6] | 1L << ((byte)local_194 & 0x3f);
              uVar14 = local_194;
              if ((int)local_194 < (int)(uint)uVar15) {
                uVar14 = (uint)uVar15;
              }
              local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<ClientSocket,std::allocator<ClientSocket>,int&,Server&>
                        (&local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(ClientSocket **)&local_1b0,
                         (allocator<ClientSocket> *)local_168,(int *)&local_194,this);
              if (((this->_handleAccept).super__Function_base._M_manager != (_Manager_type)0x0) &&
                 (std::
                  async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                            ((launch)local_168,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                             (shared_ptr<ClientSocket> *)local_180),
                 local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
              }
              std::
              vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
              ::push_back(local_178,&local_1b0);
              if (local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              uVar20 = (ulong)uVar14;
            }
            else {
              local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((ulong)local_1b0.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr & 0xffffffffffff0000);
              sVar9 = recv(iVar6,&local_1b0,1,2);
              if ((int)sVar9 < 1) {
                close(this,local_1c4);
              }
              else {
                __it_00._M_current =
                     (this->_clientSockets).
                     super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_190 = (this->_clientSockets).
                            super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                local_158 = &local_1c4;
                lVar13 = (long)local_190 - (long)__it_00._M_current;
                local_198 = uVar14;
                if (0 < lVar13 >> 6) {
                  lVar19 = (lVar13 >> 6) + 1;
                  do {
                    bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,__it_00);
                    uVar15 = local_1b8;
                    __it._M_current = __it_00._M_current;
                    this = local_1c0;
                    if (bVar5) goto LAB_00107e3f;
                    bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it_00._M_current + 1);
                    uVar15 = local_1b8;
                    __it._M_current = __it_00._M_current + 1;
                    this = local_1c0;
                    if (bVar5) goto LAB_00107e3f;
                    bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it_00._M_current + 2);
                    uVar15 = local_1b8;
                    __it._M_current = __it_00._M_current + 2;
                    this = local_1c0;
                    if (bVar5) goto LAB_00107e3f;
                    bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it_00._M_current + 3);
                    uVar15 = local_1b8;
                    __it._M_current = __it_00._M_current + 3;
                    this = local_1c0;
                    if (bVar5) goto LAB_00107e3f;
                    __it_00._M_current = __it_00._M_current + 4;
                    lVar19 = lVar19 + -1;
                    lVar13 = lVar13 + -0x40;
                  } while (1 < lVar19);
                }
                uVar15 = local_1b8;
                lVar13 = lVar13 >> 4;
                this = local_1c0;
                if (lVar13 == 1) {
LAB_00107e29:
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                    ((_Iter_pred<Server::listen()::__0> *)&local_158,__it_00);
                  __it._M_current = local_190;
                  if (bVar5) {
                    __it._M_current = __it_00._M_current;
                  }
                }
                else {
                  __it._M_current = __it_00._M_current;
                  if (lVar13 == 2) {
LAB_00107ddd:
                    this = local_1c0;
                    bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,__it);
                    if (!bVar5) {
                      __it_00._M_current = __it._M_current + 1;
                      goto LAB_00107e29;
                    }
                  }
                  else {
                    __it._M_current = local_190;
                    if ((lVar13 == 3) &&
                       (bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                          ((_Iter_pred<Server::listen()::__0> *)&local_158,__it_00),
                       __it._M_current = __it_00._M_current, this = local_1c0, !bVar5)) {
                      __it._M_current = __it_00._M_current + 1;
                      goto LAB_00107ddd;
                    }
                  }
                }
LAB_00107e3f:
                uVar20 = (ulong)local_198;
                if (((__it._M_current !=
                      (this->_clientSockets).
                      super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) &&
                    ((this->_handleRead).super__Function_base._M_manager != (_Manager_type)0x0)) &&
                   (std::
                    async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                              ((launch)(sockaddr *)&local_158,
                               (function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                               (shared_ptr<ClientSocket> *)local_188),
                   local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
                }
              }
            }
          }
          uVar14 = (uint)uVar20;
          uVar7 = local_1c4 + 1;
          uVar17 = (ulong)uVar7;
          bVar5 = (int)local_1c4 < (int)uVar15;
          local_1c4 = uVar7;
        } while (bVar5);
      }
      iVar6 = (int)uVar15;
      uVar15 = uVar15 & 0xffffffff;
      if (iVar6 < (int)uVar14) {
        uVar15 = (ulong)uVar14;
      }
      iVar6 = pthread_mutex_lock(local_1a0);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
        goto LAB_00107f4d;
      }
      piVar11 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar11 != piVar2) {
        do {
          iVar6 = *piVar11;
          bVar4 = (byte)iVar6 & 0x3f;
          iVar8 = iVar6 + 0x3f;
          if (-1 < iVar6) {
            iVar8 = iVar6;
          }
          local_148[iVar8 >> 6] =
               local_148[iVar8 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          ::close(iVar6);
          piVar11 = piVar11 + 1;
        } while (piVar11 != piVar2);
        piVar3 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
        }
      }
      pthread_mutex_unlock(local_1a0);
      puVar16 = local_148;
      paVar18 = local_b0;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(ulong *)paVar18 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        paVar18 = paVar18 + ((ulong)bVar21 * -2 + 1) * 8;
      }
      iVar6 = select((int)uVar15 + 1,(fd_set *)local_b0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    } while (iVar6 != -1);
  }
  return iVar6;
}

Assistant:

void Server::listen()
{
  _socket = socket( AF_INET, SOCK_STREAM, 0 );

  if( _socket == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );

  {
    int option = 1;

    setsockopt( _socket,
                SOL_SOCKET,
                SO_REUSEADDR,
                reinterpret_cast<const void*>( &option ),
                sizeof( option ) );
  }

  sockaddr_in socketAddress;

  std::fill( reinterpret_cast<char*>( &socketAddress ),
             reinterpret_cast<char*>( &socketAddress ) + sizeof( socketAddress ),
             0 );

  socketAddress.sin_family      = AF_INET;
  socketAddress.sin_addr.s_addr = htonl( INADDR_ANY );
  socketAddress.sin_port        = htons( _port );

  {
    int result = bind( _socket,
                       reinterpret_cast<const sockaddr*>( &socketAddress ),
                       sizeof( socketAddress ) );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  {
    int result = ::listen( _socket, _backlog );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  fd_set masterSocketSet;
  fd_set clientSocketSet;

  FD_ZERO( &masterSocketSet );
  FD_SET( _socket, &masterSocketSet );

  int highestFileDescriptor = _socket;

  while( 1 )
  {
    clientSocketSet = masterSocketSet;

    int numFileDescriptors = select( highestFileDescriptor + 1,
                                     &clientSocketSet,
                                     nullptr,   // no descriptors to write into
                                     nullptr,   // no descriptors with exceptions
                                     nullptr ); // no timeout

    if( numFileDescriptors == -1 )
      break;

    // Will be updated in the loop as soon as a new client has been
    // accepted. This saves us from modifying the variable *during*
    // the loop execution.
    int newHighestFileDescriptor = highestFileDescriptor;

    for( int i = 0; i <= highestFileDescriptor; i++ )
    {
      if( !FD_ISSET( i, &clientSocketSet ) )
        continue;

      // Handle new client
      if( i == _socket )
      {
        sockaddr_in clientAddress;
        auto clientAddressLength = sizeof(clientAddress);

        int clientFileDescriptor = accept( _socket,
                                           reinterpret_cast<sockaddr*>( &clientAddress ),
                                           reinterpret_cast<socklen_t*>( &clientAddressLength ) );

        if( clientFileDescriptor == -1 )
          break;

        FD_SET( clientFileDescriptor, &masterSocketSet );
        newHighestFileDescriptor = std::max( highestFileDescriptor, clientFileDescriptor );

        auto clientSocket = std::make_shared<ClientSocket>( clientFileDescriptor, *this );

        if( _handleAccept )
          auto result = std::async( std::launch::async, _handleAccept, clientSocket );

        _clientSockets.push_back( clientSocket );
      }

      // Known client socket
      else
      {
        char buffer[2] = {0,0};

        // Let's attempt to read at least one byte from the connection, but
        // without removing it from the queue. That way, the server can see
        // whether a client has closed the connection.
        int result = recv( i, buffer, 1, MSG_PEEK );

        if( result <= 0 )
        {
          // It would be easier to use erase-remove here, but this leads
          // to a deadlock. Instead, the current socket will be added to
          // the list of stale sockets and be closed later on.
          this->close( i );
        }
        else
        {
          auto itSocket = std::find_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == i;
                                        } );

          if( itSocket != _clientSockets.end() && _handleRead )
            auto result = std::async( std::launch::async, _handleRead, *itSocket );
        }
      }
    }

    // Update the file descriptor if a new client has been accepted in
    // the loop above.
    highestFileDescriptor = std::max( newHighestFileDescriptor, highestFileDescriptor );

    // Handle stale connections. This is in an extra scope so that the
    // lock guard unlocks the mutex automatically.
    {
      std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

      for( auto&& fileDescriptor : _staleFileDescriptors )
      {
        FD_CLR( fileDescriptor, &masterSocketSet );
        ::close( fileDescriptor );
      }

      _staleFileDescriptors.clear();
    }
  }
}